

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::init
          (BBoxRenderCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppIVar1;
  pointer *this_00;
  BBoxSize BVar2;
  Context *pCVar3;
  TestLog *log;
  IterationConfig *__first;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_01;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  RenderTarget *pRVar8;
  ProgramSources *this_01;
  ShaderProgram *this_02;
  TypedObjectWrapper<(glu::ObjectType)3> *this_03;
  TypedObjectWrapper<(glu::ObjectType)1> *this_04;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar9;
  IterationConfig *__result;
  IterationConfig *pIVar10;
  IterationConfig *pIVar11;
  undefined8 extraout_RAX_01;
  undefined8 uVar12;
  TestError *this_05;
  NotSupportedError *pNVar13;
  char *in_RCX;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
  *__alloc;
  IterationConfig *__args;
  IterationConfig *extraout_RDX;
  size_t __n;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong in_stack_fffffffffffffd38;
  string local_2b8 [32];
  ScopedLogSection section;
  undefined1 local_278 [40];
  int local_250;
  int local_24c;
  BBoxRenderCase *local_248;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  int local_200 [2];
  string local_1f8;
  string local_1d8;
  ProgramSources sources;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  iVar5 = 0x200;
  iVar18 = 0x200;
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar5 = pRVar8->m_width;
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar18 = pRVar8->m_height;
  }
  local_250 = iVar5;
  local_24c = iVar18;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar4) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sources,"Test requires GL_EXT_primitive_bounding_box extension",
                 (allocator<char> *)&stack0xfffffffffffffd40);
      tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)&sources);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_hasTessellationStage == true) {
      bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_tessellation_shader");
      if (!bVar4) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sources,"Test requires GL_EXT_tessellation_shader extension",
                   (allocator<char> *)&stack0xfffffffffffffd40);
        tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)&sources);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (this->m_hasGeometryStage == true) {
      bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
      ;
      if (!bVar4) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sources,"Test requires GL_EXT_geometry_shader extension",
                   (allocator<char> *)&stack0xfffffffffffffd40);
        tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)&sources);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  local_248 = this;
  if ((this->m_renderTarget == RENDERTARGET_DEFAULT) && ((iVar5 < 0x100 || (iVar18 < 0x100)))) {
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_220,&local_240,"Test requires ");
    local_200[1] = 0x100;
    de::toString<int>(&local_1f8,local_200 + 1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_220,&local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,"x"
                  );
    local_200[0] = 0x100;
    de::toString<int>(&local_1d8,local_200);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd40," default framebuffer");
    tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)&sources);
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Setting primitive bounding box ");
  if (this->m_calcPerPrimitiveBBox == false) {
    BVar2 = this->m_bboxSize;
    if (BVar2 == BBOXSIZE_EQUAL) {
      pcVar15 = "to exactly cover rendered grid";
    }
    else if (BVar2 == BBOXSIZE_LARGER) {
      pcVar15 = "to cover the grid and include some padding";
    }
    else {
      pcVar15 = (char *)0x0;
      if (BVar2 == BBOXSIZE_SMALLER) {
        pcVar15 = "to cover only a subset of the grid";
      }
    }
  }
  else {
    pcVar15 = "to exactly cover each generated primitive";
  }
  std::operator<<((ostream *)this_00,pcVar15);
  std::operator<<((ostream *)this_00,".\n");
  std::operator<<((ostream *)this_00,"Rendering with vertex");
  pcVar15 = "-tessellation{ctrl,eval}";
  pcVar16 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (this->m_hasTessellationStage == false) {
    pcVar15 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator<<((ostream *)this_00,pcVar15);
  if (this->m_hasGeometryStage != false) {
    pcVar16 = "-geometry";
  }
  std::operator<<((ostream *)this_00,pcVar16);
  std::operator<<((ostream *)this_00,"-fragment program.\n");
  std::operator<<((ostream *)this_00,"Set bounding box using ");
  pcVar15 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar15 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::operator<<((ostream *)this_00,pcVar15);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,
                  "Verifying rendering results are valid within the bounding box.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  pCVar3 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&section,this);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_278,(_anonymous_namespace_ *)pCVar3,(Context *)section.m_log,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&stack0xfffffffffffffd40,(string *)local_278);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)&stack0xfffffffffffffd40);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)&section);
  pCVar3 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&section,this);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_278,(_anonymous_namespace_ *)pCVar3,(Context *)section.m_log,in_RCX);
  glu::FragmentSource::FragmentSource
            ((FragmentSource *)&stack0xfffffffffffffd40,(string *)local_278);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)&stack0xfffffffffffffd40);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)&section);
  if (this->m_hasTessellationStage == true) {
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_220,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)&section,(_anonymous_namespace_ *)pCVar3,
               (Context *)local_220._M_dataplus._M_p,in_RCX);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&stack0xfffffffffffffd40,(string *)&section);
    this_01 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)&stack0xfffffffffffffd40);
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_1f8,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_240,(_anonymous_namespace_ *)pCVar3,(Context *)local_1f8._M_dataplus._M_p,
               in_RCX);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_278,&local_240);
    glu::ProgramSources::operator<<(this_01,(ShaderSource *)local_278);
    std::__cxx11::string::~string((string *)(local_278 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_220);
  }
  if (this->m_hasGeometryStage == true) {
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&section,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_278,(_anonymous_namespace_ *)pCVar3,(Context *)section.m_log,in_RCX);
    glu::GeometrySource::GeometrySource
              ((GeometrySource *)&stack0xfffffffffffffd40,(string *)local_278);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)&stack0xfffffffffffffd40);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&section);
  }
  this_02 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_02,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  data._8_8_ = 0;
  data.ptr = (ShaderProgram *)in_stack_fffffffffffffd38;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,data);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
             &stack0xfffffffffffffd40);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x2b4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffd40,"ShaderProgram",(allocator<char> *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,"Shader program",(allocator<char> *)&local_240);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,log,(string *)&stack0xfffffffffffffd40,(string *)local_278);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((((this->m_program).
        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr)->
      m_program).m_info.linkOk != false) {
    glu::ProgramSources::~ProgramSources(&sources);
    if (this->m_renderTarget == RENDERTARGET_FBO) {
      glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)0> *)&sources,
                 ((this->super_TestCase).m_context)->m_renderCtx);
      (**(code **)(lVar7 + 0xb8))
                (0xde1,(ulong)sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff);
      (**(code **)(lVar7 + 0x1380))(0xde1,1,0x8058,0x200,0x200);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"gen tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2c5);
      this_03 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
                (this_03,((this->super_TestCase).m_context)->m_renderCtx);
      data_00._8_8_ = 0;
      data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_fffffffffffffd38;
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::assignData(&(this->m_fbo).
                    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   ,data_00);
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                     *)&stack0xfffffffffffffd40);
      (**(code **)(lVar7 + 0x78))
                (0x8ca9,(((this->m_fbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          .m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar7 + 0x6a0))
                (0x8ca9,0x8ce0,0xde1,
                 (ulong)sources.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"attach",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2ca);
      (**(code **)(lVar7 + 0x78))(0x8ca9,0);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&sources);
    }
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])(this);
    this_04 = (TypedObjectWrapper<(glu::ObjectType)1> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (this_04,((this->super_TestCase).m_context)->m_renderCtx);
    data_01._8_8_ = 0;
    data_01.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)in_stack_fffffffffffffd38;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::assignData(&(this->m_vbo).
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 ,data_01);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                   *)&stack0xfffffffffffffd40);
    (**(code **)(lVar7 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar7 + 0x150))
              (0x8892,(long)((int)sources.sources[0].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)sources.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               sources.sources[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"create vbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x2d8);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &sources);
    uVar19 = 0;
    uVar12 = extraout_RAX;
    do {
      if (this->m_numIterations <= (int)uVar19) {
        return (int)uVar12;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                (&sources,this,(ulong)uVar19,&local_250);
      pIVar11 = (this->m_iterationConfigs).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar11 ==
          (this->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __first = (this->m_iterationConfigs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pIVar11 - (long)__first == 0x7fffffffffffffc0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar14 = (long)pIVar11 - (long)__first >> 6;
        uVar9 = uVar14;
        if (pIVar11 == __first) {
          uVar9 = 1;
        }
        uVar17 = uVar9 + uVar14;
        __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                   *)0x1ffffffffffffff;
        if (0x1fffffffffffffe < uVar17) {
          uVar17 = 0x1ffffffffffffff;
        }
        if (CARRY8(uVar9,uVar14)) {
          uVar17 = 0x1ffffffffffffff;
        }
        if (uVar17 == 0) {
          __result = (IterationConfig *)0x0;
          pIVar10 = __args;
        }
        else {
          __result = (IterationConfig *)operator_new(uVar17 << 6);
          pIVar10 = extraout_RDX;
        }
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                  ((allocator_type *)(__result + uVar14),(IterationConfig *)&sources,pIVar10);
        pIVar10 = std::
                  __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig*,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
                            (__first,pIVar11,__result,__alloc);
        pIVar11 = std::
                  __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig*,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
                            (pIVar11,pIVar11,pIVar10 + 1,__alloc);
        this = local_248;
        std::
        _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
        ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                         *)__first,
                        (pointer)((long)(local_248->m_iterationConfigs).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first >> 6),__n);
        (this->m_iterationConfigs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        (this->m_iterationConfigs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar11;
        (this->m_iterationConfigs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar17;
        uVar12 = extraout_RAX_01;
      }
      else {
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                  ((allocator_type *)pIVar11,(IterationConfig *)&sources,__args);
        ppIVar1 = &(this->m_iterationConfigs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
        uVar12 = extraout_RAX_00;
      }
      uVar19 = uVar19 + 1;
    } while( true );
  }
  this_05 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffd40,"failed to build program",
             (allocator<char> *)local_278);
  tcu::TestError::TestError(this_05,(string *)&stack0xfffffffffffffd40);
  __cxa_throw(this_05,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BBoxRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		renderTargetSize	= (m_renderTarget == RENDERTARGET_DEFAULT) ?
													(tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) :
													(tcu::IVec2(FBO_SIZE, FBO_SIZE));
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (!supportsES32 && m_hasTessellationStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (!supportsES32 && m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	if (m_renderTarget == RENDERTARGET_DEFAULT && (renderTargetSize.x() < RENDER_TARGET_MIN_SIZE || renderTargetSize.y() < RENDER_TARGET_MIN_SIZE))
		throw tcu::NotSupportedError(std::string() + "Test requires " + de::toString<int>(RENDER_TARGET_MIN_SIZE) + "x" + de::toString<int>(RENDER_TARGET_MIN_SIZE) + " default framebuffer");

	// log case specifics
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting primitive bounding box "
			<< ((m_calcPerPrimitiveBBox)         ? ("to exactly cover each generated primitive")
			  : (m_bboxSize == BBOXSIZE_EQUAL)   ? ("to exactly cover rendered grid")
			  : (m_bboxSize == BBOXSIZE_LARGER)  ? ("to cover the grid and include some padding")
			  : (m_bboxSize == BBOXSIZE_SMALLER) ? ("to cover only a subset of the grid")
			  : (DE_NULL))
			<< ".\n"
		<< "Rendering with vertex"
			<< ((m_hasTessellationStage) ? ("-tessellation{ctrl,eval}") : (""))
			<< ((m_hasGeometryStage) ? ("-geometry") : (""))
			<< "-fragment program.\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< "Verifying rendering results are valid within the bounding box."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_hasTessellationStage)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));
		if (m_hasGeometryStage)
			sources << glu::GeometrySource(specializeShader(m_context, genGeometrySource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	if (m_renderTarget == RENDERTARGET_FBO)
	{
		glu::Texture colorAttachment(m_context.getRenderContext());

		gl.bindTexture(GL_TEXTURE_2D, *colorAttachment);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		m_fbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *colorAttachment, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "attach");

		// unbind to prevent texture name deletion from removing it from current fbo attachments
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	}

	{
		std::vector<tcu::Vec4> data;

		getAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(data.size() * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "create vbo");
	}

	// Iterations
	for (int iterationNdx = 0; iterationNdx < m_numIterations; ++iterationNdx)
		m_iterationConfigs.push_back(generateConfig(iterationNdx, renderTargetSize));
}